

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O0

void __thiscall
PMJ02BNSampler_ElementaryIntervals_Test::TestBody(PMJ02BNSampler_ElementaryIntervals_Test *this)

{
  Allocator alloc;
  int iVar1;
  PMJ02BNSampler *this_00;
  int logSamples;
  SamplerHandle *in_stack_00000048;
  char *in_stack_00000050;
  PMJ02BNSampler *in_stack_ffffffffffffffb8;
  PMJ02BNSampler *this_01;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_c;
  
  for (local_c = 2; (int)local_c < 0xb; local_c = local_c + 2) {
    this_00 = (PMJ02BNSampler *)operator_new(0x20);
    iVar1 = 1 << (local_c & 0x1f);
    this_01 = this_00;
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)this_00);
    alloc.memoryResource._4_4_ = in_stack_ffffffffffffffd4;
    alloc.memoryResource._0_4_ = iVar1;
    pbrt::PMJ02BNSampler::PMJ02BNSampler(this_01,(int)((ulong)this_00 >> 0x20),alloc);
    pbrt::SamplerHandle::TaggedPointer<pbrt::PMJ02BNSampler>
              ((SamplerHandle *)this_00,in_stack_ffffffffffffffb8);
    checkElementarySampler(in_stack_00000050,in_stack_00000048,this._4_4_);
  }
  return;
}

Assistant:

TEST(PMJ02BNSampler, ElementaryIntervals) {
    for (int logSamples = 2; logSamples <= 10; logSamples += 2)
        checkElementarySampler("PMJ02BNSampler", new PMJ02BNSampler(1 << logSamples),
                               logSamples);
}